

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_pcode.cpp
# Opt level: O3

void __thiscall
PcodeGenerator::CallReplace
          (PcodeGenerator *this,iterator *iter_call,string *top_label,string *bottom_label,
          int argument_number)

{
  PcodeType PVar1;
  pointer pcVar2;
  long lVar3;
  uint __val;
  pointer pbVar4;
  undefined8 __n;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  Pcode *pPVar10;
  iterator iVar11;
  ulong uVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  mapped_type *pmVar13;
  vector<Pcode,_std::allocator<Pcode>_> *pvVar14;
  iterator iVar15;
  __normal_iterator<Pcode_*,_std::vector<Pcode,_std::allocator<Pcode>_>_> __last;
  pointer pbVar16;
  Pcode *pPVar17;
  string *psVar18;
  uint __len;
  Pcode *pPVar19;
  bool bVar20;
  string num3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp_vector;
  string num3;
  vector<Pcode,_std::allocator<Pcode>_> origin;
  string num3_2;
  string num2_2;
  string num2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  temp_map;
  string temp_name;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  PcodeGenerator *local_170;
  string local_168;
  vector<Pcode,_std::allocator<Pcode>_> local_148;
  key_type local_130;
  key_type local_110;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 local_d0 [32];
  float local_b0;
  size_t local_a8;
  __node_base_ptr p_Stack_a0;
  iterator *local_98;
  undefined1 local_90 [32];
  float local_70;
  size_t local_68;
  __node_base_ptr p_Stack_60;
  string *local_58;
  string local_50;
  
  pPVar17 = (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_170 = this;
  local_98 = iter_call;
  if (pPVar17 ==
      (this->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __last._M_current = (Pcode *)0x0;
    pPVar19 = (Pcode *)0x0;
  }
  else {
    pPVar19 = (Pcode *)0x0;
    __last._M_current = (Pcode *)0x0;
    do {
      PVar1 = pPVar17->m_op;
      pcVar2 = (pPVar17->m_num1)._M_dataplus._M_p;
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar2,pcVar2 + (pPVar17->m_num1)._M_string_length);
      __n = local_90._8_8_;
      if (local_90._8_8_ == top_label->_M_string_length) {
        if (local_90._8_8_ == 0) {
          bVar20 = true;
        }
        else {
          iVar6 = bcmp((void *)local_90._0_8_,(top_label->_M_dataplus)._M_p,local_90._8_8_);
          bVar20 = iVar6 == 0;
        }
        pPVar10 = pPVar19;
        if (bVar20) {
          pPVar10 = pPVar17;
        }
        if (PVar1 == LABEL) {
          pPVar19 = pPVar10;
        }
      }
      if (__n == bottom_label->_M_string_length) {
        if (__n == 0) {
          bVar20 = true;
        }
        else {
          iVar6 = bcmp((void *)local_90._0_8_,(bottom_label->_M_dataplus)._M_p,__n);
          bVar20 = iVar6 == 0;
        }
        pPVar10 = __last._M_current;
        if (bVar20) {
          pPVar10 = pPVar17;
        }
        if (PVar1 == LABEL) {
          __last._M_current = pPVar10;
        }
      }
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_);
      }
      pPVar17 = pPVar17 + 1;
    } while (pPVar17 !=
             (local_170->m_pcode_queue).super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::vector<Pcode,std::allocator<Pcode>>::
  vector<__gnu_cxx::__normal_iterator<Pcode*,std::vector<Pcode,std::allocator<Pcode>>>,void>
            ((vector<Pcode,std::allocator<Pcode>> *)&local_148,pPVar19 + 1,__last,
             (allocator_type *)local_90);
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar11._M_current =
         local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.super__Vector_impl_data
         ._M_start;
    do {
      pcVar2 = ((iVar11._M_current)->m_num1)._M_dataplus._M_p;
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar2,pcVar2 + ((iVar11._M_current)->m_num1)._M_string_length);
      local_d0._0_8_ = local_d0 + 0x10;
      pcVar2 = ((iVar11._M_current)->m_num2)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,pcVar2,pcVar2 + ((iVar11._M_current)->m_num2)._M_string_length);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      pcVar2 = ((iVar11._M_current)->m_num3)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,pcVar2,pcVar2 + ((iVar11._M_current)->m_num3)._M_string_length
                );
      PVar1 = (iVar11._M_current)->m_op;
      bVar20 = IsTempName((string *)local_90);
      if (bVar20) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_188,(string *)local_90);
      }
      bVar20 = IsTempName((string *)local_d0);
      if (bVar20) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_188,(string *)local_d0);
      }
      bVar20 = IsTempName(&local_168);
      if (bVar20) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_188,&local_168);
      }
      if ((PVar1 == JUMP) && (iVar6 = std::__cxx11::string::compare((char *)local_90), iVar6 == 0))
      {
        iVar11 = std::vector<Pcode,_std::allocator<Pcode>_>::_M_erase(&local_148,iVar11);
        iVar11._M_current = iVar11._M_current + -1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_);
      }
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_);
      }
      pbVar4 = local_188.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar16 = local_188.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar11._M_current = iVar11._M_current + 1;
    } while (iVar11._M_current !=
             local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar12 = (long)local_188.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_188.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar3 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_188.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_188.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar16,pbVar4);
    }
  }
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_188.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_188.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_188,(iterator)__first._M_current,
             (iterator)
             local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_90._0_8_ = &p_Stack_60;
  local_90._8_8_ = 1;
  local_90._16_8_ = 0;
  local_90._24_8_ = 0;
  local_70 = 1.0;
  local_68 = 0;
  p_Stack_60 = (__node_base_ptr)0x0;
  if (local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar16 = local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      GetNextTemp_abi_cxx11_((string *)local_d0,local_170);
      pmVar13 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_90,pbVar16);
      std::__cxx11::string::_M_assign((string *)pmVar13);
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_);
      }
      pbVar16 = pbVar16 + 1;
    } while (pbVar16 !=
             local_188.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    psVar18 = (string *)
              &(local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                super__Vector_impl_data._M_start)->m_num2;
    do {
      local_d0._0_8_ = local_d0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,*(long *)(psVar18 + -0x20),
                 *(long *)(psVar18 + -0x18) + *(long *)(psVar18 + -0x20));
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,*(long *)psVar18,*(long *)(psVar18 + 8) + *(long *)psVar18);
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,*(long *)(psVar18 + 0x20),
                 *(long *)(psVar18 + 0x28) + *(long *)(psVar18 + 0x20));
      bVar20 = IsTempName((string *)local_d0);
      if (bVar20) {
        std::__detail::
        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)local_90,(string *)local_d0);
        std::__cxx11::string::_M_assign(psVar18 + -0x20);
      }
      bVar20 = IsTempName(&local_168);
      if (bVar20) {
        std::__detail::
        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)local_90,&local_168);
        std::__cxx11::string::_M_assign(psVar18);
      }
      bVar20 = IsTempName(&local_1a8);
      if (bVar20) {
        std::__detail::
        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)local_90,&local_1a8);
        std::__cxx11::string::_M_assign(psVar18 + 0x20);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p);
      }
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_);
      }
      pPVar17 = (Pcode *)(psVar18 + 0x60);
      psVar18 = psVar18 + 0x88;
    } while (pPVar17 !=
             local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pvVar14 = &local_170->m_pcode_queue;
  if (argument_number != 0) {
    local_d0._0_8_ = &p_Stack_a0;
    local_d0._8_8_ = 1;
    local_d0._16_8_ = 0;
    local_d0._24_8_ = 0;
    local_b0 = 1.0;
    local_a8 = 0;
    p_Stack_a0 = (__node_base_ptr)0x0;
    pPVar17 = local_98->_M_current;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    pcVar2 = (pPVar17->m_num3)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,pcVar2,pcVar2 + (pPVar17->m_num3)._M_string_length);
    if ((pvVar14->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.super__Vector_impl_data
        ._M_start != pPVar17) {
      iVar6 = 0;
      do {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        PVar1 = pPVar17->m_op;
        pcVar2 = (pPVar17->m_num1)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,pcVar2,pcVar2 + (pPVar17->m_num1)._M_string_length);
        pcVar2 = (pPVar17->m_num2)._M_dataplus._M_p;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar2,pcVar2 + (pPVar17->m_num2)._M_string_length);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        pcVar2 = (pPVar17->m_num3)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar2,pcVar2 + (pPVar17->m_num3)._M_string_length);
        bVar20 = true;
        if (((PVar1 == PARA) && (local_130._M_string_length == local_168._M_string_length)) &&
           ((local_130._M_string_length == 0 ||
            (iVar7 = bcmp(local_130._M_dataplus._M_p,local_168._M_dataplus._M_p,
                          local_130._M_string_length), iVar7 == 0)))) {
          uVar8 = atoi(local_110._M_dataplus._M_p);
          if (uVar8 == 0) {
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_d0,&local_1a8);
            std::__cxx11::string::_M_assign((string *)pmVar13);
            pPVar17->m_op = NOP;
          }
          else {
            GetNextTemp_abi_cxx11_(&local_50,local_170);
            pPVar17->m_op = ASSIGN;
            std::__cxx11::string::_M_assign((string *)&pPVar17->m_num1);
            __val = -uVar8;
            if (0 < (int)uVar8) {
              __val = uVar8;
            }
            __len = 1;
            if (9 < __val) {
              uVar12 = (ulong)__val;
              uVar5 = 4;
              do {
                __len = uVar5;
                uVar9 = (uint)uVar12;
                if (uVar9 < 100) {
                  __len = __len - 2;
                  goto LAB_00134a01;
                }
                if (uVar9 < 1000) {
                  __len = __len - 1;
                  goto LAB_00134a01;
                }
                if (uVar9 < 10000) goto LAB_00134a01;
                uVar12 = uVar12 / 10000;
                uVar5 = __len + 4;
              } while (99999 < uVar9);
              __len = __len + 1;
            }
LAB_00134a01:
            local_f0[0] = local_e0;
            std::__cxx11::string::_M_construct
                      ((ulong)local_f0,(char)__len - (char)((int)uVar8 >> 0x1f));
            local_58 = (string *)&pPVar17->m_num2;
            std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_f0[0] + (uVar8 >> 0x1f),__len,__val);
            std::__cxx11::string::_M_assign(local_58);
            if (local_f0[0] != local_e0) {
              operator_delete(local_f0[0]);
            }
            local_f0[0] = local_e0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"");
            std::__cxx11::string::_M_assign((string *)&pPVar17->m_num3);
            if (local_f0[0] != local_e0) {
              operator_delete(local_f0[0]);
            }
            pmVar13 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_d0,&local_1a8);
            std::__cxx11::string::_M_assign((string *)pmVar13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          iVar6 = iVar6 + 1;
          bVar20 = iVar6 != argument_number;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p);
        }
        pPVar19 = (pvVar14->super__Vector_base<Pcode,_std::allocator<Pcode>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (!bVar20) {
          bVar20 = pPVar17 == pPVar19;
          if (!bVar20) {
            if (local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              bVar20 = false;
            }
            else {
              psVar18 = (string *)
                        &(local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_num2;
              do {
                local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1a8,*(long *)(psVar18 + -0x20),
                           *(long *)(psVar18 + -0x18) + *(long *)(psVar18 + -0x20));
                local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_110,*(long *)psVar18,
                           *(long *)(psVar18 + 8) + *(long *)psVar18);
                local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_130,*(long *)(psVar18 + 0x20),
                           *(long *)(psVar18 + 0x28) + *(long *)(psVar18 + 0x20));
                iVar15 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_d0,&local_1a8);
                if (iVar15.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_d0,&local_1a8);
                  std::__cxx11::string::_M_assign(psVar18 + -0x20);
                }
                iVar15 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_d0,&local_110);
                if (iVar15.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_d0,&local_110);
                  std::__cxx11::string::_M_assign(psVar18);
                }
                iVar15 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)local_d0,&local_130);
                if (iVar15.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_d0,&local_130);
                  std::__cxx11::string::_M_assign(psVar18 + 0x20);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  operator_delete(local_110._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                  operator_delete(local_1a8._M_dataplus._M_p);
                }
                pPVar17 = (Pcode *)(psVar18 + 0x60);
                psVar18 = psVar18 + 0x88;
              } while (pPVar17 !=
                       local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            goto LAB_00134d04;
          }
          break;
        }
        pPVar17 = pPVar17 + -1;
      } while (pPVar17 != pPVar19);
    }
    CallReplace();
    bVar20 = true;
LAB_00134d04:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_d0);
    if (bVar20) goto LAB_00134d55;
  }
  pPVar17 = local_98->_M_current;
  pPVar17->m_op = NOP;
  std::vector<Pcode,std::allocator<Pcode>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Pcode*,std::vector<Pcode,std::allocator<Pcode>>>>
            ((vector<Pcode,std::allocator<Pcode>> *)pvVar14,pPVar17,
             local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_148.super__Vector_base<Pcode,_std::allocator<Pcode>_>._M_impl.
             super__Vector_impl_data._M_finish);
LAB_00134d55:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  std::vector<Pcode,_std::allocator<Pcode>_>::~vector(&local_148);
  return;
}

Assistant:

void PcodeGenerator::CallReplace(const vector<Pcode>::iterator& iter_call, const string& top_label, const string& bottom_label, int argument_number) {
    vector<Pcode>::iterator iter_top;
    vector<Pcode>::iterator iter_bottom;
    for (auto iter=m_pcode_queue.begin(); iter != m_pcode_queue.end(); ++iter) {
        PcodeType op = iter->GetOP();
        string num1 = iter->GetNum1();
        if (num1 == top_label && op == LABEL)
            iter_top = iter;
        if (num1 == bottom_label && op == LABEL)
            iter_bottom = iter;
    }
    iter_top++;
    vector<Pcode> origin(iter_top, iter_bottom);
    // replace temp
    vector<string> temp_vector;
    for (auto iter=origin.begin(); iter != origin.end(); ++iter) {
        string num1 = iter->GetNum1();
        string num2 = iter->GetNum2();
        string num3 = iter->GetNum3();
        PcodeType op = iter->GetOP();
        if (IsTempName(num1)) {
            temp_vector.push_back(num1);
        }
        if (IsTempName(num2)) {
            temp_vector.push_back(num2);
        }
        if (IsTempName(num3)) {
            temp_vector.push_back(num3);
        }
        
        if (op == JUMP && num1 == "RA") {  // remove JUMP RA
            iter = origin.erase(iter);
            iter--;
        }
    }
    sort(temp_vector.begin(), temp_vector.end());
    temp_vector.erase(unique(temp_vector.begin(), temp_vector.end()), temp_vector.end());
    unordered_map<string, string> temp_map;
    for (auto iter=temp_vector.begin(); iter != temp_vector.end(); ++iter) {
        string new_temp = this->GetNextTemp();
        temp_map[*iter] = new_temp;
    }
    for (auto iter=origin.begin(); iter != origin.end(); ++iter) {
        string num1 = iter->GetNum1();
        string num2 = iter->GetNum2();
        string num3 = iter->GetNum3();
        PcodeType op = iter->GetOP();
        if (IsTempName(num1)) {
            //printf("%s---%s\n", num1.c_str(), temp_map[num1].c_str());
            iter->SetNum1(temp_map[num1]);
        }
        if (IsTempName(num2)) {
            //printf("%s---%s\n", num2.c_str(), temp_map[num2].c_str());
            iter->SetNum2(temp_map[num2]);
        }
        if (IsTempName(num3)) {
            //printf("%s---%s\n", num3.c_str(), temp_map[num3].c_str());
            iter->SetNum3(temp_map[num3]);
        }
    }
    // replace argument
    if (argument_number != 0) {
        unordered_map<string, string> para_map;
        auto iter = iter_call;
        int count = 0;
        string func_name = iter_call->GetNum3();
        for (; iter != m_pcode_queue.begin(); iter--) {
            PcodeType op = iter->GetOP();
            string num1 = iter->GetNum1();
            string num2 = iter->GetNum2();
            string num3 = iter->GetNum3();
            if (op == PARA && num3 == func_name) {
                int value = atoi(num2.c_str());
                if (value == 0) {
                    para_map[num1] = num2;
                    iter->SetOP(NOP);
                } else {
                    string temp_name = this->GetNextTemp();
                    //Pcode pcode(ASSIGN, temp_name, std::to_string(value), EMPTY_STR);
                    //iter = m_pcode_queue.insert(iter, pcode);
                    //iter--;
                    iter->SetOP(ASSIGN);
                    iter->SetNum1(temp_name);
                    iter->SetNum2(std::to_string(value));
                    iter->SetNum3(EMPTY_STR);
                    para_map[num1] = temp_name;
                }
                count++;
                if (count == argument_number) {
                    break;
                }
            }
        }
        if (iter == m_pcode_queue.begin()) {
            fprintf(stderr, "no enough argument\n");
            return;
        }
        for (auto iter=origin.begin(); iter != origin.end(); ++iter) {
            string num1 = iter->GetNum1();
            string num2 = iter->GetNum2();
            string num3 = iter->GetNum3();
            PcodeType op = iter->GetOP();
            if (para_map.find(num1) != para_map.end()) {
                iter->SetNum1(para_map[num1]);
            }
            if (para_map.find(num2) != para_map.end()) {
                iter->SetNum2(para_map[num2]);
            }
            if (para_map.find(num3) != para_map.end()) {
                iter->SetNum3(para_map[num3]);
            }
        }
    }
    // insert
    iter_call->SetOP(NOP);
    //printf("insert begin%d\n", m_pcode_queue.size());
    m_pcode_queue.insert(iter_call, origin.begin(), origin.end());
    //printf("insert end%d\n", m_pcode_queue.size());
}